

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv_walk(uv_loop_t *loop,uv_walk_cb walk_cb,void *arg)

{
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  uv_handle_t *h;
  QUEUE *q;
  undefined8 *local_20;
  
  for (local_20 = *(undefined8 **)(in_RDI + 0x10); local_20 != (undefined8 *)(in_RDI + 0x10);
      local_20 = (undefined8 *)*local_20) {
    if ((*(uint *)(local_20 + 2) & 0x8000) == 0) {
      (*in_RSI)(local_20 + -4,in_RDX);
    }
  }
  return;
}

Assistant:

void uv_walk(uv_loop_t* loop, uv_walk_cb walk_cb, void* arg) {
  QUEUE* q;
  uv_handle_t* h;

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);
    if (h->flags & UV__HANDLE_INTERNAL) continue;
    walk_cb(h, arg);
  }
}